

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O3

uint64_t yactfr::internal::anon_unknown_0::readFlUIntLe28At6(uint8_t *buf)

{
  return (ulong)(((*(ushort *)(buf + 3) & 0x3ff) << 0x12 | (uint)buf[2] << 10) + (uint)buf[1] * 4 |
                (uint)(*buf >> 6));
}

Assistant:

std::uint64_t readFlUIntLe28At6(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[4];
    res <<= 8;
    res |= buf[3];
    res <<= 8;
    res |= buf[2];
    res <<= 8;
    res |= buf[1];
    res <<= 2;
    res |= (buf[0] >> 6);
    res &= UINT64_C(0xfffffff);
    return res;
}